

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O0

double __thiscall libDAI::TRW::runTRW(TRW *this)

{
  bool bVar1;
  value vVar2;
  ostream *poVar3;
  long *plVar4;
  ulong uVar5;
  size_t sVar6;
  clock_t cVar7;
  void *this_00;
  long *in_RDI;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  size_t in_stack_00000098;
  TRW *in_stack_000000a0;
  Factor nb;
  size_t i_1;
  size_t k;
  size_t t_2;
  size_t t_1;
  size_t t;
  double diff;
  double logZ_cur;
  double logZ_prev;
  size_t e;
  size_t i;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> old_beliefs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> edge_seq;
  Diffs diffs;
  clock_t tic;
  undefined4 in_stack_fffffffffffffc88;
  DistType in_stack_fffffffffffffc8c;
  TFactor<double> *in_stack_fffffffffffffc90;
  TFactor<double> *in_stack_fffffffffffffc98;
  ostream *in_stack_fffffffffffffca0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffca8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffcb0;
  size_type in_stack_fffffffffffffcb8;
  Diffs *in_stack_fffffffffffffcc0;
  size_type in_stack_fffffffffffffcc8;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  *in_stack_fffffffffffffcd0;
  size_t in_stack_fffffffffffffce8;
  TRW *in_stack_fffffffffffffcf0;
  ostream *in_stack_fffffffffffffd08;
  Diffs *in_stack_fffffffffffffd10;
  size_t in_stack_fffffffffffffe80;
  TRW *in_stack_fffffffffffffe88;
  size_type local_150;
  size_type local_140;
  ulong local_128;
  ulong local_120;
  double local_118;
  double local_100;
  ulong local_f0;
  ulong local_b0;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90 [3];
  clock_t local_40;
  string local_28 [40];
  
  if (in_RDI[0x28] != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Starting ");
    (**(code **)(*in_RDI + 0x48))();
    poVar3 = std::operator<<(poVar3,local_28);
    std::operator<<(poVar3,":inner_loop ...");
    std::__cxx11::string::~string(local_28);
  }
  if (2 < (ulong)in_RDI[0x28]) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  init_messages((TRW *)in_stack_fffffffffffffcb0._M_current);
  local_40 = toc();
  plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
  (**(code **)(*plVar4 + 0x28))();
  Diffs::Diffs(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
               (double)in_stack_fffffffffffffcb0._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xba3bb4);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xba3bc1)
  ;
  plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
  (**(code **)(*plVar4 + 0x28))();
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  local_b0 = 0;
  while( true ) {
    plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar5 = (**(code **)(*plVar4 + 0x28))();
    if (uVar5 <= local_b0) break;
    beliefV(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_fffffffffffffc90,
               (value_type *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    TFactor<double>::~TFactor(in_stack_fffffffffffffc90);
    local_b0 = local_b0 + 1;
  }
  (**(code **)(*in_RDI + 0x28))();
  FactorGraph::nrEdges((FactorGraph *)0xba3d3c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8);
  local_f0 = 0;
  while( true ) {
    (**(code **)(*in_RDI + 0x28))();
    sVar6 = FactorGraph::nrEdges((FactorGraph *)0xba3da1);
    if (sVar6 <= local_f0) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffca0,
               (value_type_conflict2 *)in_stack_fffffffffffffc98);
    local_f0 = local_f0 + 1;
  }
  (**(code **)(*in_RDI + 0x68))();
  local_100 = std::real<double>((complex<double> *)0xba3e5a);
  local_118 = INFINITY;
  in_RDI[0x2b] = 0;
  while( true ) {
    bVar1 = false;
    if ((ulong)in_RDI[0x2b] < (ulong)in_RDI[0x26]) {
      bVar1 = (double)in_RDI[0x24] < local_118;
    }
    if (!bVar1) break;
    vVar2 = UpdateType::operator_cast_to_value((UpdateType *)(in_RDI + 0x23));
    if (vVar2 == PARALL) {
      local_120 = 0;
      while( true ) {
        (**(code **)(*in_RDI + 0x28))();
        sVar6 = FactorGraph::nrEdges((FactorGraph *)0xba3f60);
        if (sVar6 <= local_120) break;
        calcNewMessage(in_stack_000000a0,in_stack_00000098);
        local_120 = local_120 + 1;
      }
      local_128 = 0;
      while( true ) {
        (**(code **)(*in_RDI + 0x28))();
        sVar6 = FactorGraph::nrEdges((FactorGraph *)0xba3ff5);
        if (sVar6 <= local_128) break;
        updateMessage(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        local_128 = local_128 + 1;
      }
    }
    else {
      vVar2 = UpdateType::operator_cast_to_value((UpdateType *)(in_RDI + 0x23));
      if (vVar2 == SEQRND) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        std::
        random_shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      }
      local_140 = 0;
      while( true ) {
        (**(code **)(*in_RDI + 0x28))();
        sVar6 = FactorGraph::nrEdges((FactorGraph *)0xba4103);
        if (sVar6 <= local_140) break;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_90,local_140);
        calcNewMessage(in_stack_000000a0,in_stack_00000098);
        updateMessage(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        local_140 = local_140 + 1;
      }
    }
    local_150 = 0;
    while( true ) {
      plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
      uVar5 = (**(code **)(*plVar4 + 0x28))();
      if (uVar5 <= local_150) break;
      beliefV(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                (&local_a8,local_150);
      dist(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
      Diffs::push(in_stack_fffffffffffffd10,(double)in_stack_fffffffffffffd08);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                (&local_a8,local_150);
      TFactor<double>::operator=
                (in_stack_fffffffffffffc90,
                 (TFactor<double> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      TFactor<double>::~TFactor(in_stack_fffffffffffffc90);
      local_150 = local_150 + 1;
    }
    (**(code **)(*in_RDI + 0x68))();
    dVar8 = std::real<double>((complex<double> *)0xba433f);
    if (2 < (ulong)in_RDI[0x28]) {
      poVar3 = std::operator<<((ostream *)&std::cout,"TRW::runTRW:  maxdiff ");
      dVar9 = Diffs::max((Diffs *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar9);
      poVar3 = std::operator<<(poVar3,", logZ_diff ");
      auVar13._8_8_ = 0x7fffffffffffffff;
      auVar13._0_8_ = 0x7fffffffffffffff;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar8 - local_100;
      auVar10 = vpand_avx(auVar10,auVar13);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,auVar10._0_8_);
      poVar3 = std::operator<<(poVar3," after ");
      in_stack_fffffffffffffd10 = (Diffs *)std::ostream::operator<<(poVar3,in_RDI[0x2b] + 1);
      in_stack_fffffffffffffd08 = std::operator<<((ostream *)in_stack_fffffffffffffd10," passes");
      std::ostream::operator<<(in_stack_fffffffffffffd08,std::endl<char,std::char_traits<char>>);
    }
    local_118 = Diffs::max((Diffs *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    auVar14._8_8_ = 0x7fffffffffffffff;
    auVar14._0_8_ = 0x7fffffffffffffff;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar8 - local_100;
    auVar10 = vpand_avx(auVar11,auVar14);
    if (local_118 < auVar10._0_8_) {
      auVar15._8_8_ = 0x7fffffffffffffff;
      auVar15._0_8_ = 0x7fffffffffffffff;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar8 - local_100;
      auVar10 = vpand_avx(auVar12,auVar15);
      local_118 = auVar10._0_8_;
    }
    in_RDI[0x2b] = in_RDI[0x2b] + 1;
    local_100 = dVar8;
  }
  if ((double)in_RDI[0x2a] < local_118) {
    in_RDI[0x2a] = (long)local_118;
  }
  if (in_RDI[0x28] != 0) {
    if (local_118 <= (double)in_RDI[0x24]) {
      if (2 < (ulong)in_RDI[0x28]) {
        std::operator<<((ostream *)&std::cout,"TRW::runTRW:  ");
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"converged in ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI[0x2b]);
      poVar3 = std::operator<<(poVar3," passes (");
      cVar7 = toc();
      in_stack_fffffffffffffca0 = (ostream *)std::ostream::operator<<(poVar3,cVar7 - local_40);
      poVar3 = std::operator<<(in_stack_fffffffffffffca0," clocks).");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      if (in_RDI[0x28] == 1) {
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"TRW::runTRW:  WARNING: not converged within ")
      ;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI[0x26]);
      poVar3 = std::operator<<(poVar3," passes (");
      cVar7 = toc();
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,cVar7 - local_40);
      poVar3 = std::operator<<(poVar3," clocks)...final maxdiff:");
      this_00 = (void *)std::ostream::operator<<(poVar3,local_118);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
  }
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             in_stack_fffffffffffffca0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffca0);
  Diffs::~Diffs((Diffs *)0xba479b);
  return local_118;
}

Assistant:

double TRW::runTRW() {
        if( Props.verbose >= 1 )
            cout << "Starting " << identify() << ":inner_loop ...";
        if( Props.verbose >= 3)
           cout << endl; 

        init_messages();

        clock_t tic = toc();
        Diffs   diffs(grm().nrVars(), 1.0);
        
        vector<size_t> edge_seq;

        vector<Factor> old_beliefs;
        old_beliefs.reserve( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            old_beliefs.push_back(beliefV(i));

        edge_seq.reserve( grm().nrEdges() );
        for( size_t e = 0; e < grm().nrEdges(); e++ )
            edge_seq.push_back( e );

        double logZ_prev = INFINITY;
        double logZ_cur  = real(logZ());

        // do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        // and logZ difference is smaller than tolerance
        double diff = INFINITY;
        for( _iterations = 0; _iterations < Props.maxiter && diff > Props.tol; _iterations++ ) {
            if( Props.updates == UpdateType::PARALL ) {
                // Parallel updates 
                for( size_t t = 0; t < grm().nrEdges(); t++ )
                    calcNewMessage(t);

                for( size_t t = 0; t < grm().nrEdges(); t++ )
                    updateMessage( t );
            } else {
                // Sequential updates
                if( Props.updates == UpdateType::SEQRND )
                    random_shuffle( edge_seq.begin(), edge_seq.end() );
                
                for( size_t t = 0; t < grm().nrEdges(); t++ ) {
                    size_t k = edge_seq[t];
                    calcNewMessage( k );
                    updateMessage( k );
                }
            }

            // calculate new beliefs and compare with old ones
            for( size_t i = 0; i < grm().nrVars(); i++ ) {
                Factor nb( beliefV(i) );
                diffs.push( dist( nb, old_beliefs[i], Prob::DISTLINF ) );
                old_beliefs[i] = nb;
            }
            logZ_prev = logZ_cur;
            logZ_cur  = real(logZ());

            if( Props.verbose >= 3 )
                cout << "TRW::runTRW:  maxdiff " << diffs.max() << ", logZ_diff " << fabs(logZ_cur - logZ_prev) << " after " << _iterations+1 << " passes" << endl;

            diff = diffs.max();
            if( fabs(logZ_cur - logZ_prev) > diff )
                diff = fabs(logZ_cur - logZ_prev);
        }

        if( diff > _maxdiff )
            _maxdiff = diff;

        if( Props.verbose >= 1 ) {
            if( diff > Props.tol ) {
                if( Props.verbose == 1 )
                    cout << endl;
                    cout << "TRW::runTRW:  WARNING: not converged within " << Props.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diff << endl;
            } else {
                if( Props.verbose >= 3 )
                    cout << "TRW::runTRW:  ";
                    cout << "converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
            }
        }

        return diff;
    }